

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O2

Time __thiscall L11_1::Time::sum(Time *this,Time *t)

{
  int iVar1;
  
  iVar1 = this->minute % 0x3c + t->minute;
  return (Time)((ulong)(uint)(iVar1 / 0x3c + this->minute / 0x3c + this->hour + t->hour) |
               (long)iVar1 % 0x3c << 0x20);
}

Assistant:

Time Time::sum(const Time &t) const {
    //  局部变量存储 sum
    Time total;
    total.reset(hour, minute);
    total.addHour(t.hour);
    total.addMin(t.minute);
    //  实际上返回了该局部变量的拷贝供函数外使用，原本局部变量被删除
    return total;
}